

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

void __thiscall Matrix3f::setRow(Matrix3f *this,int i,Vector3f *v)

{
  Vector3f *in_RDX;
  int in_ESI;
  long in_RDI;
  float fVar1;
  
  fVar1 = Vector3f::x(in_RDX);
  *(float *)(in_RDI + (long)in_ESI * 4) = fVar1;
  fVar1 = Vector3f::y(in_RDX);
  *(float *)(in_RDI + (long)(in_ESI + 3) * 4) = fVar1;
  fVar1 = Vector3f::z(in_RDX);
  *(float *)(in_RDI + (long)(in_ESI + 6) * 4) = fVar1;
  return;
}

Assistant:

void Matrix3f::setRow( int i, const Vector3f& v )
{
	m_elements[ i ] = v.x();
	m_elements[ i + 3 ] = v.y();
	m_elements[ i + 6 ] = v.z();
}